

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O1

void __thiscall
PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::
set_display_type(ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0> *this,
                DisplayType display_type)

{
  byte bVar1;
  
  if ((this->ppi_handler_).high_switches_observed_ == false) {
    bVar1 = (this->ppi_handler_).high_switches_;
    if (((bVar1 & 3) != 0) && ((bVar1 & 3) != 3)) {
      (this->ppi_handler_).high_switches_ =
           ((bVar1 & 0xfc) - ((display_type & ~SVideo) == CompositeColour)) + '\x02';
    }
  }
  return;
}

Assistant:

void hint_is_composite(bool composite) {
			if(high_switches_observed_) {
				return;
			}

			switch(high_switches_ & 3) {
				// Do nothing if a non-CGA card is in use.
				case 0b00:	case 0b11:
					break;

				default:
					high_switches_ &= ~0b11;
					high_switches_ |= composite ? 0b01 : 0b10;
				break;
			}
		}